

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_dd5232::BacktraceData::Add
          (BacktraceData *this,cmListFileBacktrace *bt,ArrayIndex *index)

{
  ulong uVar1;
  cmListFileContext *value;
  bool bVar2;
  bool bVar3;
  ArrayIndex AVar4;
  _Hash_node_base *p_Var5;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  _Var6;
  Value *pVVar7;
  mapped_type *pmVar8;
  __hash_code __code;
  ulong uVar9;
  string *__k;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar12;
  cmListFileContext *top;
  ArrayIndex parent;
  ArrayIndex fileIndex;
  Value entry;
  cmListFileContext *local_160;
  Value *local_158;
  undefined1 local_150 [40];
  string local_128;
  ArrayIndex *local_108;
  ArrayIndex local_fc;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  bVar2 = cmListFileBacktrace::Empty(bt);
  if (!bVar2) {
    local_160 = cmListFileBacktrace::Top(bt);
    uVar1 = (this->NodeMap)._M_h._M_bucket_count;
    uVar9 = (ulong)local_160 % uVar1;
    p_Var10 = (this->NodeMap)._M_h._M_buckets[uVar9];
    p_Var11 = (__node_base_ptr)0x0;
    if ((p_Var10 != (__node_base_ptr)0x0) &&
       (p_Var5 = p_Var10->_M_nxt, p_Var11 = p_Var10,
       local_160 != (cmListFileContext *)p_Var10->_M_nxt[1]._M_nxt)) {
      while (p_Var10 = p_Var5, p_Var5 = p_Var10->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var11 = (__node_base_ptr)0x0;
        if (((ulong)p_Var5[1]._M_nxt % uVar1 != uVar9) ||
           (p_Var11 = p_Var10, local_160 == (cmListFileContext *)p_Var5[1]._M_nxt))
        goto LAB_002d27fd;
      }
      p_Var11 = (__node_base_ptr)0x0;
    }
LAB_002d27fd:
    if (p_Var11 == (__node_base_ptr)0x0) {
      p_Var5 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var5 = p_Var11->_M_nxt;
    }
    if (p_Var5 == (_Hash_node_base *)0x0) {
      local_108 = index;
      Json::Value::Value(&local_f8,objectValue);
      __k = &local_160->FilePath;
      _Var6._M_cur = (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(this->FileMap)._M_h,__k);
      if (_Var6._M_cur == (__node_type *)0x0) {
        local_158 = &this->Files;
        local_fc = Json::Value::size(local_158);
        pVar12 = std::
                 _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::__cxx11::string_const&,unsigned_int&>
                           ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)&this->FileMap,__k);
        _Var6._M_cur = (__node_type *)
                       pVar12.first.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                       ._M_cur;
        RelativeIfUnder(&local_128,&this->TopSource,__k);
        Json::Value::Value((Value *)local_150,&local_128);
        Json::Value::append(local_158,(Value *)local_150);
        Json::Value::~Value((Value *)local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(ArrayIndex)local_128._M_dataplus._M_p) !=
            &local_128.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_128._M_dataplus._M_p._4_4_,
                                   (ArrayIndex)local_128._M_dataplus._M_p),
                          local_128.field_2._M_allocated_capacity + 1);
        }
      }
      Json::Value::Value(&local_58,
                         *(UInt *)((long)&((_Var6._M_cur)->
                                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                          ).
                                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                          ._M_storage._M_storage + 0x20));
      pVVar7 = Json::Value::operator[](&local_f8,"file");
      Json::Value::operator=(pVVar7,&local_58);
      Json::Value::~Value(&local_58);
      if (local_160->Line != 0) {
        Json::Value::Value(&local_80,(Int)local_160->Line);
        pVVar7 = Json::Value::operator[](&local_f8,"line");
        Json::Value::operator=(pVVar7,&local_80);
        Json::Value::~Value(&local_80);
      }
      value = local_160;
      if ((local_160->Name)._M_string_length != 0) {
        _Var6._M_cur = (__node_type *)
                       std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&(this->CommandMap)._M_h,&local_160->Name);
        if (_Var6._M_cur == (__node_type *)0x0) {
          local_158 = &this->Commands;
          local_128._M_dataplus._M_p._0_4_ = Json::Value::size(local_158);
          pVar12 = std::
                   _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                   ::_M_emplace<std::__cxx11::string_const&,unsigned_int&>
                             ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                               *)&this->CommandMap,value);
          _Var6._M_cur = (__node_type *)
                         pVar12.first.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                         ._M_cur;
          Json::Value::Value((Value *)local_150,&value->Name);
          Json::Value::append(local_158,(Value *)local_150);
          Json::Value::~Value((Value *)local_150);
        }
        Json::Value::Value(&local_a8,
                           *(UInt *)((long)&((_Var6._M_cur)->
                                            super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                                            ._M_storage._M_storage + 0x20));
        pVVar7 = Json::Value::operator[](&local_f8,"command");
        Json::Value::operator=(pVVar7,&local_a8);
        Json::Value::~Value(&local_a8);
      }
      cmListFileBacktrace::Pop((cmListFileBacktrace *)local_150);
      bVar3 = Add(this,(cmListFileBacktrace *)local_150,(ArrayIndex *)&local_128);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_);
      }
      if (bVar3) {
        Json::Value::Value(&local_d0,(ArrayIndex)local_128._M_dataplus._M_p);
        pVVar7 = Json::Value::operator[](&local_f8,"parent");
        Json::Value::operator=(pVVar7,&local_d0);
        Json::Value::~Value(&local_d0);
      }
      AVar4 = Json::Value::size(&this->Nodes);
      pmVar8 = std::__detail::
               _Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_cmListFileContext_*,_std::pair<const_cmListFileContext_*const,_unsigned_int>,_std::allocator<std::pair<const_cmListFileContext_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_cmListFileContext_*>,_std::hash<const_cmListFileContext_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->NodeMap,&local_160);
      *pmVar8 = AVar4;
      *local_108 = AVar4;
      Json::Value::append(&this->Nodes,&local_f8);
      Json::Value::~Value(&local_f8);
    }
    else {
      *index = *(ArrayIndex *)&p_Var5[2]._M_nxt;
    }
  }
  return !bVar2;
}

Assistant:

bool BacktraceData::Add(cmListFileBacktrace const& bt, Json::ArrayIndex& index)
{
  if (bt.Empty()) {
    return false;
  }
  cmListFileContext const* top = &bt.Top();
  auto found = this->NodeMap.find(top);
  if (found != this->NodeMap.end()) {
    index = found->second;
    return true;
  }
  Json::Value entry = Json::objectValue;
  entry["file"] = this->AddFile(top->FilePath);
  if (top->Line) {
    entry["line"] = static_cast<int>(top->Line);
  }
  if (!top->Name.empty()) {
    entry["command"] = this->AddCommand(top->Name);
  }
  Json::ArrayIndex parent;
  if (this->Add(bt.Pop(), parent)) {
    entry["parent"] = parent;
  }
  index = this->NodeMap[top] = this->Nodes.size();
  this->Nodes.append(std::move(entry)); // NOLINT(*)
  return true;
}